

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_triangles_iterators.h
# Opt level: O2

Simplex * __thiscall
Gudhi::skeleton_blocker::
Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
::dereference(Simplex *__return_storage_ptr__,
             Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
             *this)

{
  uint uVar1;
  Vertex_handle args;
  Vertex_handle args_1;
  _List_node_base *p_Var2;
  reference_type pVVar3;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> oStack_38;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> local_30;
  
  p_Var2 = (this->current_edge_).edge_iterator.first.
           super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
           .m_iterator._M_node;
  uVar1 = *(uint *)((long)&p_Var2[2]._M_next + 4);
  args.vertex = (this->v_).vertex;
  (*this->complex_->_vptr_Skeleton_blocker_complex[3])
            (&local_30,this->complex_,(ulong)*(uint *)&p_Var2[2]._M_next);
  pVVar3 = boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
           get(&local_30);
  args_1.vertex = pVVar3->vertex;
  (*this->complex_->_vptr_Skeleton_blocker_complex[3])(&oStack_38,this->complex_,(ulong)uVar1);
  pVVar3 = boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
           get(&oStack_38);
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            (__return_storage_ptr__,args,args_1,(Vertex_handle)pVVar3->vertex);
  return __return_storage_ptr__;
}

Assistant:

Simplex dereference() const {
    Root_vertex_handle v1 = (*link_)[*current_edge_].first();
    Root_vertex_handle v2 = (*link_)[*current_edge_].second();
    return Simplex(v_, *(complex_->get_address(v1)), *(complex_->get_address(v2)));
  }